

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPExternalTransmitter::WaitForIncomingData
          (RTPExternalTransmitter *this,RTPTime *delay,bool *dataavailable)

{
  bool bVar1;
  SocketType local_30;
  int status;
  SocketType abortSock;
  int8_t isset;
  bool *dataavailable_local;
  RTPTime *delay_local;
  RTPExternalTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x97;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x96;
  }
  else if ((this->waitingfordata & 1U) == 0) {
    this->waitingfordata = true;
    _abortSock = dataavailable;
    dataavailable_local = (bool *)delay;
    delay_local = (RTPTime *)this;
    bVar1 = std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
            empty(&this->rawpacketlist);
    if (bVar1) {
      status._3_1_ = '\0';
      local_30 = RTPAbortDescriptors::GetAbortSocket(&this->m_abortDesc);
      this_local._4_4_ =
           RTPSelect(&local_30,(int8_t *)((long)&status + 3),1,
                     (RTPTime)*(double *)dataavailable_local);
      if (this_local._4_4_ < 0) {
        this->waitingfordata = false;
      }
      else {
        this->waitingfordata = false;
        if ((this->created & 1U) == 0) {
          this_local._4_4_ = 0;
        }
        else {
          if (status._3_1_ != '\0') {
            RTPAbortDescriptors::ClearAbortSignal(&this->m_abortDesc);
          }
          if (_abortSock != (bool *)0x0) {
            bVar1 = std::__cxx11::
                    list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::empty
                              (&this->rawpacketlist);
            if (bVar1) {
              *_abortSock = false;
            }
            else {
              *_abortSock = true;
            }
          }
          this_local._4_4_ = 0;
        }
      }
    }
    else {
      if (_abortSock != (bool *)0x0) {
        *_abortSock = true;
      }
      this->waitingfordata = false;
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = -0x8d;
  }
  return this_local._4_4_;
}

Assistant:

int RTPExternalTransmitter::WaitForIncomingData(const RTPTime &delay,bool *dataavailable)
{
	if (!init)
		return ERR_RTP_EXTERNALTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOTCREATED;
	}
	if (waitingfordata)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_ALREADYWAITING;
	}
	
	waitingfordata = true;

	if (!rawpacketlist.empty())
	{
		if (dataavailable != 0)
			*dataavailable = true;
		waitingfordata = false;
		MAINMUTEX_UNLOCK
		return 0;
	}
	
	WAITMUTEX_LOCK
	MAINMUTEX_UNLOCK

	int8_t isset = 0;
	SocketType abortSock = m_abortDesc.GetAbortSocket();
	int status = RTPSelect(&abortSock, &isset, 1, delay);
	if (status < 0)
	{
		MAINMUTEX_LOCK
		waitingfordata = false;
		MAINMUTEX_UNLOCK
		WAITMUTEX_UNLOCK
		return status;
	}
	
	MAINMUTEX_LOCK
	waitingfordata = false;
	if (!created) // destroy called
	{
		MAINMUTEX_UNLOCK;
		WAITMUTEX_UNLOCK
		return 0;
	}
		
	// if aborted, read from abort buffer
	if (isset)
		m_abortDesc.ClearAbortSignal();

	if (dataavailable != 0)
	{
		if (rawpacketlist.empty())
			*dataavailable = false;
		else
			*dataavailable = true;
	}	
	
	MAINMUTEX_UNLOCK
	WAITMUTEX_UNLOCK
	return 0;
}